

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O2

vector<nuraft::raft_server::peer_info,_std::allocator<nuraft::raft_server::peer_info>_> * __thiscall
nuraft::raft_server::get_peer_info_all
          (vector<nuraft::raft_server::peer_info,_std::allocator<nuraft::raft_server::peer_info>_>
           *__return_storage_ptr__,raft_server *this)

{
  __node_base *p_Var1;
  ptr<peer> pp;
  peer_info pi;
  unique_lock<std::recursive_mutex> guard;
  value_type entry;
  __shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2> local_80;
  value_type local_70;
  unique_lock<std::recursive_mutex> local_58;
  pair<const_int,_std::shared_ptr<nuraft::peer>_> local_48;
  
  (__return_storage_ptr__->
  super__Vector_base<nuraft::raft_server::peer_info,_std::allocator<nuraft::raft_server::peer_info>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<nuraft::raft_server::peer_info,_std::allocator<nuraft::raft_server::peer_info>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<nuraft::raft_server::peer_info,_std::allocator<nuraft::raft_server::peer_info>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (((this->leader_).super___atomic_base<int>._M_i == this->id_) && ((this->role_)._M_i == leader)
     ) {
    std::unique_lock<std::recursive_mutex>::unique_lock(&local_58,&this->lock_);
    p_Var1 = &(this->peers_)._M_h._M_before_begin;
    while (p_Var1 = p_Var1->_M_nxt, p_Var1 != (__node_base *)0x0) {
      std::pair<const_int,_std::shared_ptr<nuraft::peer>_>::pair
                (&local_48,(pair<const_int,_std::shared_ptr<nuraft::peer>_> *)(p_Var1 + 1));
      local_70.id_ = -1;
      local_70.last_log_idx_ = 0;
      local_70.last_succ_resp_us_ = 0;
      std::__shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_80,
                 &local_48.second.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>);
      local_70.id_ = (((local_80._M_ptr)->config_).
                      super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                     id_;
      local_70.last_log_idx_ =
           ((local_80._M_ptr)->last_accepted_log_idx_).super___atomic_base<unsigned_long>._M_i;
      local_70.last_succ_resp_us_ = timer_helper::get_us(&(local_80._M_ptr)->last_resp_timer_);
      std::vector<nuraft::raft_server::peer_info,_std::allocator<nuraft::raft_server::peer_info>_>::
      push_back(__return_storage_ptr__,&local_70);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_80._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_48.second.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
    std::unique_lock<std::recursive_mutex>::~unique_lock(&local_58);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<raft_server::peer_info> raft_server::get_peer_info_all() const {
    std::vector<raft_server::peer_info> ret;
    if (!is_leader()) return ret;

    recur_lock(lock_);
    for (auto entry: peers_) {
        peer_info pi;
        ptr<peer> pp = entry.second;
        pi.id_ = pp->get_id();
        pi.last_log_idx_ = pp->get_last_accepted_log_idx();
        pi.last_succ_resp_us_ = pp->get_resp_timer_us();
        ret.push_back(pi);
    }
    return ret;
}